

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O2

void __thiscall
jsonnet::internal::FixIndentation::fields
          (FixIndentation *this,ObjectFields *fields,Indent *indent,bool space_before)

{
  ObjectField *field;
  uint indent_00;
  ObjectField *pOVar1;
  AST *pAVar2;
  uint uVar3;
  Fodder *fodder;
  bool bVar4;
  byte bVar5;
  Indent new_indent2;
  
  indent_00 = indent->lineUp;
  pOVar1 = (fields->
           super__Vector_base<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  fodder = &((fields->
             super__Vector_base<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
             )._M_impl.super__Vector_impl_data._M_start)->commaFodder;
  bVar4 = true;
  do {
    field = (ObjectField *)(fodder + -0xb);
    if (field == pOVar1) {
      return;
    }
    if (!bVar4) {
      this->column = this->column + 1;
    }
    if (field->kind < (LOCAL|FIELD_ID)) {
      bVar5 = ~bVar4;
      switch(field->kind) {
      case ASSERT:
        fill(this,&((ObjectField *)(fodder + -0xb))->fodder1,(bool)((bVar5 | space_before) & 1),true
             ,indent_00);
        uVar3 = this->column;
        this->column = uVar3 + 6;
        pAVar2 = left_recursive_deep(*(AST **)((long)(fodder + -1) + 8));
        new_indent2 = newIndent(this,&pAVar2->openFodder,indent,uVar3 + 7);
        expr(this,*(AST **)((long)(fodder + -1) + 8),indent,true);
        if (*(long *)((long)(fodder + -1) + 0x10) == 0) goto LAB_00183e20;
        fill(this,(Fodder *)((long)(fodder + -2) + 8),true,true,new_indent2.lineUp);
        this->column = this->column + 1;
        pAVar2 = *(AST **)((long)(fodder + -1) + 0x10);
        goto LAB_00183e10;
      case FIELD_ID:
        fill(this,&((ObjectField *)(fodder + -0xb))->fodder1,(bool)((bVar5 | space_before) & 1),true
             ,indent_00);
        this->column = this->column + (int)((*(Identifier **)(fodder + -6))->name)._M_string_length;
        break;
      case FIELD_EXPR:
        fill(this,&((ObjectField *)(fodder + -0xb))->fodder1,(bool)((bVar5 | space_before) & 1),true
             ,indent_00);
        this->column = this->column + 1;
        expr(this,*(AST **)((long)(fodder + -7) + 0x10),indent,false);
        fill(this,(Fodder *)((long)(fodder + -10) + 8),false,false,indent_00);
        this->column = this->column + 1;
        break;
      case FIELD_STR:
        expr(this,*(AST **)((long)(fodder + -7) + 0x10),indent,(bool)((bVar5 | space_before) & 1));
        break;
      case LOCAL:
        fill(this,&((ObjectField *)(fodder + -0xb))->fodder1,(bool)((bVar5 | space_before) & 1),true
             ,indent->lineUp);
        this->column = this->column + 5;
        fill(this,(Fodder *)((long)(fodder + -10) + 8),true,true,indent->lineUp);
        this->column = this->column + (int)((*(Identifier **)(fodder + -6))->name)._M_string_length;
        fieldParams(this,field,indent);
        fill(this,(Fodder *)((long)(fodder + -2) + 8),true,true,indent->lineUp);
        uVar3 = this->column + 1;
        goto LAB_00183de7;
      }
      fieldParams(this,field,indent);
      fill(this,(Fodder *)((long)(fodder + -2) + 8),false,false,indent_00);
      if (*(char *)((long)(fodder + -7) + 0xc) == '\x01') {
        this->column = this->column + 1;
      }
      uVar3 = this->column;
      if ((ulong)*(uint *)((long)(fodder + -7) + 8) < 3) {
        uVar3 = uVar3 + *(int *)(&DAT_0020416c + (ulong)*(uint *)((long)(fodder + -7) + 8) * 4);
LAB_00183de7:
        this->column = uVar3;
      }
      pAVar2 = left_recursive_deep(*(AST **)((long)(fodder + -1) + 8));
      new_indent2 = newIndent(this,&pAVar2->openFodder,indent,uVar3);
      pAVar2 = *(AST **)((long)(fodder + -1) + 8);
LAB_00183e10:
      expr(this,pAVar2,&new_indent2,true);
    }
LAB_00183e20:
    bVar4 = false;
    fill(this,fodder,false,false,indent_00);
    fodder = fodder + 0xc;
  } while( true );
}

Assistant:

void fields(ObjectFields &fields, const Indent &indent, bool space_before)
    {
        unsigned new_indent = indent.lineUp;
        bool first = true;
        for (auto &field : fields) {
            if (!first)
                column++;  // ','

            switch (field.kind) {
                case ObjectField::LOCAL: {
                    fill(field.fodder1, !first || space_before, true, indent.lineUp);
                    column += 5;  // local
                    fill(field.fodder2, true, true, indent.lineUp);
                    column += field.id->name.length();
                    fieldParams(field, indent);
                    fill(field.opFodder, true, true, indent.lineUp);
                    column++;  // =
                    Indent new_indent2 = newIndent(open_fodder(field.expr2), indent, column);
                    expr(field.expr2, new_indent2, true);
                } break;

                case ObjectField::FIELD_ID:
                case ObjectField::FIELD_STR:
                case ObjectField::FIELD_EXPR: {
                    if (field.kind == ObjectField::FIELD_ID) {
                        fill(field.fodder1, !first || space_before, true, new_indent);
                        column += field.id->name.length();

                    } else if (field.kind == ObjectField::FIELD_STR) {
                        expr(field.expr1, indent, !first || space_before);

                    } else if (field.kind == ObjectField::FIELD_EXPR) {
                        fill(field.fodder1, !first || space_before, true, new_indent);
                        column++;  // [
                        expr(field.expr1, indent, false);
                        fill(field.fodder2, false, false, new_indent);
                        column++;  // ]
                    }

                    fieldParams(field, indent);

                    fill(field.opFodder, false, false, new_indent);

                    if (field.superSugar)
                        column++;
                    switch (field.hide) {
                        case ObjectField::INHERIT: column += 1; break;
                        case ObjectField::HIDDEN: column += 2; break;
                        case ObjectField::VISIBLE: column += 3; break;
                    }
                    Indent new_indent2 = newIndent(open_fodder(field.expr2), indent, column);
                    expr(field.expr2, new_indent2, true);

                } break;

                case ObjectField::ASSERT: {
                    fill(field.fodder1, !first || space_before, true, new_indent);
                    column += 6;  // assert
                    // + 1 for the space after the assert
                    Indent new_indent2 = newIndent(open_fodder(field.expr2), indent, column + 1);
                    expr(field.expr2, indent, true);
                    if (field.expr3 != nullptr) {
                        fill(field.opFodder, true, true, new_indent2.lineUp);
                        column++;  // ":"
                        expr(field.expr3, new_indent2, true);
                    }
                } break;
            }

            first = false;
            fill(field.commaFodder, false, false, new_indent);
        }
    }